

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubTransport_StartWorkerThread
          (TRANSPORT_HANDLE transportHandle,IOTHUB_CLIENT_CORE_HANDLE clientHandle,
          IOTHUB_CLIENT_MULTIPLEXED_DO_WORK muxDoWork)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  TRANSPORT_HANDLE_DATA *transportData;
  IOTHUB_CLIENT_RESULT result;
  IOTHUB_CLIENT_MULTIPLEXED_DO_WORK muxDoWork_local;
  IOTHUB_CLIENT_CORE_HANDLE clientHandle_local;
  TRANSPORT_HANDLE transportHandle_local;
  
  if ((transportHandle == (TRANSPORT_HANDLE)0x0) || (clientHandle == (IOTHUB_CLIENT_CORE_HANDLE)0x0)
     ) {
    transportData._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    if (transportHandle->clientDoWork == (IOTHUB_CLIENT_MULTIPLEXED_DO_WORK)0x0) {
      transportHandle->clientDoWork = muxDoWork;
    }
    transportData._4_4_ = start_worker_if_needed(transportHandle,clientHandle);
    if (transportData._4_4_ == IOTHUB_CLIENT_OK) {
      transportData._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"IoTHubTransport_StartWorkerThread",0x188,1,"Unable to start thread safely");
      }
    }
  }
  return transportData._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_StartWorkerThread(TRANSPORT_HANDLE transportHandle, IOTHUB_CLIENT_CORE_HANDLE clientHandle, IOTHUB_CLIENT_MULTIPLEXED_DO_WORK muxDoWork)
{
    IOTHUB_CLIENT_RESULT result;
    if (transportHandle == NULL || clientHandle == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;

        if (transportData->clientDoWork == NULL)
        {
            transportData->clientDoWork = muxDoWork;
        }

        if ((result = start_worker_if_needed(transportData, clientHandle)) != IOTHUB_CLIENT_OK)
        {
            LogError("Unable to start thread safely");
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }
    return result;
}